

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftad.cpp
# Opt level: O2

int __thiscall CVmBifTADS::rand(CVmBifTADS *this)

{
  ushort uVar1;
  bool bVar2;
  bool bVar3;
  err_frame_t *peVar4;
  CVmException *pCVar5;
  int32_t iVar6;
  uint32_t uVar7;
  int extraout_EAX;
  int iVar8;
  int extraout_EAX_00;
  ulong rand_val;
  char *pcVar9;
  ushort *puVar10;
  RandStrParser *this_00;
  undefined8 *puVar11;
  long *plVar12;
  undefined8 unaff_RBP;
  int iVar13;
  vm_val_t ret;
  err_frame_t err_cur__;
  
  iVar13 = (int)this;
  iVar6 = (int32_t)CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
  if (iVar13 == 0) {
    bVar3 = true;
    bVar2 = true;
  }
  else if (iVar13 == 1) {
    if (sp_[-1].typ == VM_INT) {
      iVar6 = sp_[-1].val.intval;
      bVar3 = true;
      sp_ = sp_ + -1;
    }
    else {
      iVar8 = vm_val_t::is_listlike(sp_ + -1);
      if ((iVar8 == 0) || (iVar6 = vm_val_t::ll_length(sp_ + -1), iVar6 < 0)) {
        pcVar9 = vm_val_t::get_as_string(sp_ + -1);
        if (pcVar9 != (char *)0x0) {
          puVar10 = (ushort *)vm_val_t::get_as_string(sp_ + -1);
          uVar1 = *puVar10;
          this_00 = (RandStrParser *)operator_new(0x18);
          RandStrParser::RandStrParser(this_00,(char *)(puVar10 + 1),(ulong)uVar1);
          puVar11 = (undefined8 *)_ZTW11G_err_frame();
          err_cur__.prv_ = (err_frame_t *)*puVar11;
          plVar12 = (long *)_ZTW11G_err_frame();
          *plVar12 = (long)&err_cur__;
          err_cur__.state_ = _setjmp((__jmp_buf_tag *)err_cur__.jmpbuf_);
          if (err_cur__.state_ == 0) {
            RandStrParser::exec(this_00,&ret);
            CVmBif::retval(&ret);
          }
          if (-1 < (short)err_cur__.state_) {
            err_cur__.state_ = err_cur__.state_ | 0x8000;
            if (this_00->tree != (RandStrNode *)0x0) {
              (*this_00->tree->_vptr_RandStrNode[1])();
            }
            operator_delete(this_00,0x18);
          }
          peVar4 = err_cur__.prv_;
          puVar11 = (undefined8 *)_ZTW11G_err_frame();
          *puVar11 = peVar4;
          if ((err_cur__.state_ & 0x4001U) != 0) {
            puVar11 = (undefined8 *)_ZTW11G_err_frame();
            if ((*(byte *)*puVar11 & 2) != 0) {
              plVar12 = (long *)_ZTW11G_err_frame();
              free(*(void **)(*plVar12 + 0x10));
            }
            pCVar5 = err_cur__.exc_;
            plVar12 = (long *)_ZTW11G_err_frame();
            *(CVmException **)(*plVar12 + 0x10) = pCVar5;
            err_rethrow();
          }
          if ((err_cur__.state_ & 2U) != 0) {
            free(err_cur__.exc_);
            err_cur__.state_ = extraout_EAX_00;
          }
          sp_ = sp_ + -1;
          return err_cur__.state_;
        }
        iVar6 = 1;
        bVar2 = false;
        bVar3 = true;
        goto LAB_002531e0;
      }
      bVar3 = false;
    }
    bVar2 = true;
  }
  else {
    bVar2 = false;
    bVar3 = true;
    iVar6 = iVar13;
  }
LAB_002531e0:
  uVar7 = rng_next();
  rand_val = (ulong)uVar7;
  if (iVar13 != 0) {
    rand_val = rand_range(rand_val,(long)iVar6);
  }
  if (bVar2) {
    if (bVar3) {
      CVmBif::retval_int(rand_val);
      iVar8 = extraout_EAX;
    }
    else {
      if (iVar6 == 0) {
        err_cur__.state_ = 1;
      }
      else {
        vm_val_t::ll_index(sp_ + -1,(vm_val_t *)&err_cur__,(int)rand_val + 1);
      }
      CVmBif::retval((vm_val_t *)&err_cur__);
      iVar8 = 0x378118;
      sp_ = sp_ + -1;
    }
  }
  else {
    CVmBif::retval(sp_ + (-1 - (long)(int)rand_val));
    iVar8 = iVar13 * 0x10;
    sp_ = sp_ + -(long)iVar13;
  }
  return iVar8;
}

Assistant:

void CVmBifTADS::rand(VMG_ uint argc)
{
    int32_t range;
    int use_range;
    int choose_an_arg = FALSE;
    int choose_an_ele = FALSE;
    ulong rand_val;

    /* determine the desired range of values based on the arguments */
    if (argc == 0)
    {
        /* 
         *   if no argument is given, produce a random number in our full
         *   range - clear the 'use_range' flag to so indicate
         */
        use_range = FALSE;
    }
    else if (argc == 1 && G_stk->get(0)->typ == VM_INT)
    {
        /* we're returning a number in the range 0..(arg-1) */
        range = G_stk->get(0)->val.intval;
        use_range = TRUE;

        /* discard the argument */
        G_stk->discard();
    }
    else if (argc == 1
             && G_stk->get(0)->is_listlike(vmg0_)
             && (range = G_stk->get(0)->ll_length(vmg0_)) >= 0)
    {
        /* use the range of 1..length */
        use_range = TRUE;

        /* note that we're choosing from a list-like object */
        choose_an_ele = TRUE;

        /* note - leave the object on the stack as gc protection */
    }
    else if (argc == 1
             && G_stk->get(0)->get_as_string(vmg0_) != 0)
    {
        /* 
         *   It's a string, giving a template for generating a new random
         *   string.  First, get the string argument.  
         */
        const char *tpl = G_stk->get(0)->get_as_string(vmg0_);
        size_t tplbytes = vmb_get_len(tpl);
        tpl += VMB_LEN;

#if 1
        /* parse it */
        RandStrParser *rsp = new RandStrParser(tpl, tplbytes);

        err_try
        {
            /* generate the string */
            vm_val_t ret;
            rsp->exec(vmg_ &ret);

            /* return it */
            retval(vmg_ &ret);
        }
        err_finally
        {
            /* delete our parser on the way out */
            delete rsp;
        }
        err_end;
        
#else
        /* figure its character length */
        utf8_ptr tplp((char *)tpl);
        size_t tplchars = tplp.len(tplbytes);

        /* allocate temporary space for the result, as wide characters */
        wchar_t *buf = new wchar_t[tplchars], *dst;

        /* run through the template and generate random characters */
        for (dst = buf ; tplbytes != 0 ; )
        {
            /* generate a random number for this character */
            rand_val = rng_next(vmg0_);

            /* get and skip the next template character */
            wchar_t tch = tplp.getch();
            tplp.inc(&tplbytes);

            /* translate the template character */
            wchar_t ch;
            switch (tch)
            {
            case '.':
                /* printable ASCII character 32-126 */
                ch = (wchar_t)rand_range(rand_val, 32, 126);
                break;

            case '?':
                /* printable Latin-1 character 32-126, 160-255 */
                ch = (wchar_t)rand_range(rand_val, 32, 126, 160, 255);
                break;

            case '*':
                /* 
                 *   Printable Unicode character.  This excludes undefined
                 *   character, the private use area, and the control
                 *   characters.  
                 */
                for (;;)
                {
                    /* exclude the control and private use ranges */
                    ch = (wchar_t)rand_range(
                        rand_val, 32, 127, 160, 0xDFFF, 0xF900, 0xFFFE);

                    /* if it's a unicode character, we're set */
                    if (t3_is_unichar(ch))
                        break;

                    /* pick a new random number */
                    rand_val = rng_next(vmg0_);
                }
                break;

            case '9':
                /* digit 0-9 */
                ch = (wchar_t)rand_range(rand_val, '0', '9');
                break;

            case 'X':
                /* upper-case hex digit 0-9 A-F */
                ch = (wchar_t)rand_range(rand_val, '0', '9', 'A', 'F');
                break;

            case 'x':
                /* lower-case hex digit 0-9 a-f */
                ch = (wchar_t)rand_range(rand_val, '0', '9', 'a', 'f');
                break;

            case 'A':
                /* letter A-Z */
                ch = (wchar_t)rand_range(rand_val, 'A', 'Z');
                break;

            case 'a':
                /* letter a-z */
                ch = (wchar_t)rand_range(rand_val, 'a', 'z');
                break;

            case 'b':
                /* random byte value 0-255 */
                ch = (wchar_t)rand_range(rand_val, 0, 255);
                break;

            case 'c':
                /* mixed-case letter A-Z a-z */
                ch = (wchar_t)rand_range(rand_val, 'a', 'z', 'A', 'Z');
                break;

            case 'z':
                /* mixed-case letter or number 0-9 a-z A-Z */
                ch = (wchar_t)rand_range(rand_val,
                                         '0', '9', 'a', 'z', 'A', 'Z');
                break;

            case '[':
                /* 
                 *   Character range.  Scan the range to count the number of
                 *   characters included.  
                 */
                {
                    /* 
                     *   allocate a list of range descriptors - use 'len2' as
                     *   the range count, since at the most we could have one
                     *   range per byte (but it'll usually be less) 
                     */
                    struct rdesc
                    {
                        int set(wchar_t c)
                        {
                            start = end = c;
                            return 1;
                        }
                        int set(wchar_t a, wchar_t b)
                        {
                            if (b > a)
                                start = a, end = b;
                            else
                                start = b, end = a;
                            return end - start + 1;
                        }
                        wchar_t start;
                        wchar_t end;
                    };
                    rdesc *ranges = new rdesc[tplbytes];
                    int nranges = 0, nchars = 0;

                    /* scan for the closing ']' */
                    for ( ; tplbytes != 0 && tplp.getch() != ']' ;
                          tplp.inc(&tplbytes))
                    {
                        /* check for escapes */
                        wchar_t rch = tplp.getch();
                        if (rch == '%')
                        {
                            tplp.inc(&tplbytes);
                            rch = tplp.getch();
                        }
                        
                        /* if the next character is '-', it's a range */
                        if (tplbytes > 1 && tplp.getch_at(1) == '-')
                        {
                            /* skip the current character and the '-' */
                            tplp.inc(&tplbytes);
                            tplp.inc(&tplbytes);

                            /* if the next character is quoted, skip the % */
                            if (tplbytes > 1 && tplp.getch() == '%')
                                tplp.inc(&tplbytes);

                            /* 
                             *   The range count includes everything from
                             *   'rch' to the current character.  
                             */
                            if (tplbytes != 0)
                                nchars += ranges[nranges++].set(
                                    rch, tplp.getch());
                        }
                        else
                        {
                            /* it's a single character range */
                            nchars += ranges[nranges++].set(rch);
                        }
                        
                        /* if we're out of characters, we're done */
                        if (tplbytes == 0)
                            break;
                    }

                    /* pick a number from 0 to rcnt */
                    ch = (wchar_t)rand_range(rand_val, nchars);

                    /* find the character */
                    for (int i = 0 ; i < nranges ; ++i)
                    {
                        /* if it's in the current range, apply it */
                        const rdesc *r = &ranges[i];
                        if (ch <= r->end - r->start)
                        {
                            ch += r->start;
                            break;
                        }

                        /* 
                         *   it's not in this range, so deduct the range
                         *   length from the remainder and keep going 
                         */
                        ch -= r->end - r->start + 1;
                    }

                    /* done with the range list */
                    delete [] ranges;

                    /* skip the closing ']' */
                    if (tplbytes != 0 && tplp.getch() == ']')
                        tplp.inc(&tplbytes);
                }
                break;

            case '%':
                /* copy the next character unchanged */
                if (tplbytes != 0)
                {
                    ch = tplp.getch();
                    tplp.inc(&tplbytes);
                }
                else
                    ch = '%';
                break;

            default:
                /* no character */
                continue;
            }

            /* save it in our temp buffer, and note its utf8 size */
            *dst++ = ch;
        }

        /* convert the temp buffer to a real string */
        retval_obj(vmg_ CVmObjString::create(vmg_ FALSE, buf, dst - buf));

        /* done with the temporary buffer */
        delete [] buf;
#endif
        
        /* discard the argument */
        G_stk->discard();

        /* we're done */
        return;
    }
    else
    {
        /* 
         *   produce a random number in the range 0..(argc-1) so that we
         *   can select one of our arguments 
         */
        range = argc;
        use_range = TRUE;

        /* note that we should choose an argument value */
        choose_an_arg = TRUE;
    }

    /* get the next random number */
    rand_val = rng_next(vmg0_);

    /*
     *   Calculate our random value in the range 0..(range-1).  If range
     *   == 0, simply choose a value across our full range.  
     */
    if (use_range)
        rand_val = rand_range(rand_val, range);

    /*
     *   Return the appropriate value, depending on our argument list 
     */
    if (choose_an_arg)
    {
        /* return the selected argument */
        retval(vmg_ G_stk->get((int)rand_val));

        /* discard all of the arguments */
        G_stk->discard(argc);
    }
    else if (choose_an_ele)
    {
        vm_val_t val;

        /* get the selected element */
        if (range == 0)
        {
            /* there are no elements to choose from, so return nil */
            val.set_nil();
        }
        else
        {
            /* get the selected list element */
            G_stk->get(0)->ll_index(vmg_ &val, rand_val + 1);
        }

        /* set the result */
        retval(vmg_ &val);

        /* discard our gc protection */
        G_stk->discard();
    }
    else
    {
        /* simply return the random number */
        retval_int(vmg_ (long)rand_val);
    }
}